

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findkey.c
# Opt level: O0

LispPTR N_OP_findkey(LispPTR tos,int byte)

{
  ushort local_2a;
  DLword *pDStack_28;
  DLword arg_nth;
  DLword *find_end;
  LispPTR *ptr;
  int byte_local;
  LispPTR tos_local;
  
  if ((MachineState.pvar[-10] & 1) == 0) {
    pDStack_28 = MachineState.pvar + -0x10;
  }
  else {
    pDStack_28 = NativeAligned2FromStackOffset(MachineState.pvar[-1] - 4);
  }
  local_2a = (short)byte + 1;
  find_end = MachineState.ivar + (byte * 2 + -2);
  while( true ) {
    if (pDStack_28 < find_end) {
      return 0;
    }
    if (*(LispPTR *)find_end == tos) break;
    find_end = find_end + 4;
    local_2a = local_2a + 2;
  }
  return local_2a | 0xe0000;
}

Assistant:

LispPTR N_OP_findkey(LispPTR tos, int byte) {
  LispPTR *ptr;
  DLword *find_end;
  DLword arg_nth;

#ifdef TRACE
  printPC();
  printf("TRACE : N_OP_findkey \n");
#endif

  if (CURRENTFX->alink & 1) { /* slow case */
    find_end = NativeAligned2FromStackOffset(CURRENTFX->blink - 4);
  } else { /*  Fast cae */
    find_end = ((DLword *)CURRENTFX) - 2 - 4;
  }

  arg_nth = byte + 1;

  for (ptr = (LispPTR *)(IVar + ((byte * 2) - 2)); (UNSIGNED)find_end >= (UNSIGNED)ptr;
       ptr += 2, arg_nth += 2) {
    if (*ptr == tos) { /* KEY founded */
      return (S_POSITIVE | arg_nth);
    }
  } /* for end */

  /* No matched */

  return (NIL_PTR);

}